

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

int __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_Line *line,ON_3dPoint *box_point,double *t0,double *t1)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ON_3dPoint *pOVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  ON_BoundingBox *pOVar12;
  ulong uVar13;
  int iVar14;
  ON_3dVector *pOVar15;
  ulong uVar16;
  int iVar17;
  ON_BoundingBox *this_00;
  int iVar18;
  long lVar19;
  int j;
  long lVar20;
  bool bVar21;
  int iVar22;
  ulong uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  uint uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  ON_3dPoint closest;
  ON_3dVector n;
  int ihi [3];
  ON_3dVector ProjDir;
  ON_Interval overlap;
  ON_Interval pl;
  int ilo [3];
  ON_3dPoint center;
  ON_3dPoint cp;
  double local_1b8;
  uint local_1a0;
  int local_19c;
  int local_18c;
  ON_3dPoint local_178;
  ON_BoundingBox *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  int local_134;
  ON_3dPoint *local_130;
  ulong local_128;
  ON_BoundingBox *local_120;
  ON_3dPoint local_118;
  int local_f8 [4];
  ON_3dPoint local_e8;
  ON_Interval local_d0;
  ON_3dVector local_c0;
  double *local_a8;
  double *local_a0;
  ulong local_98;
  ulong local_90;
  int local_88 [4];
  ON_3dVector local_78 [2];
  ON_3dVector local_48;
  
  bVar6 = IsNotEmpty(this);
  if (!bVar6) {
    return 0;
  }
  bVar6 = ON_Line::IsValid(line);
  if (!bVar6) {
    return 0;
  }
  pOVar15 = local_78;
  ON_Line::Direction(pOVar15,line);
  dVar29 = ON_3dVector::Length(pOVar15);
  if (dVar29 <= 1.490116119385e-08) {
    ON_Line::PointAt((ON_3dPoint *)local_78,line,0.5);
    if (t0 != (double *)0x0) {
      *t0 = 0.0;
    }
    if (t1 != (double *)0x0) {
      *t1 = 1.0;
    }
    ClosestPoint(&local_178,this,(ON_3dPoint *)local_78);
    box_point->z = local_178.z;
    box_point->x = local_178.x;
    box_point->y = local_178.y;
    if (local_78[0].x < (this->m_min).x) {
      return 1;
    }
    if ((this->m_max).x < local_78[0].x) {
      return 1;
    }
    if ((this->m_min).y <= local_78[0].y) {
      if ((this->m_max).y < local_78[0].y) {
        return 1;
      }
      if ((this->m_min).z <= local_78[0].z) {
        return (uint)(local_78[0].z <= (this->m_max).z) * 2 + 1;
      }
      return 1;
    }
    return 1;
  }
  lVar20 = 0;
  local_150 = t0;
  local_130 = box_point;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)&local_78[0].x + lVar20));
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x30);
  local_120 = (ON_BoundingBox *)&this->m_max;
  lVar20 = 0;
  local_158 = this;
  do {
    pOVar8 = ON_Line::operator[](line,0);
    iVar18 = (int)lVar20;
    dVar29 = ON_3dPoint::operator[](pOVar8,iVar18);
    pOVar8 = ON_Line::operator[](line,1);
    dVar1 = ON_3dPoint::operator[](pOVar8,iVar18);
    ON_Interval::ON_Interval((ON_Interval *)&local_c0,dVar29,dVar1);
    pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_c0,0);
    dVar29 = *pdVar9;
    pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_c0,1);
    this_00 = local_158;
    if ((dVar29 != *pdVar9) || (NAN(dVar29) || NAN(*pdVar9))) {
      local_178.z = (local_158->m_min).z;
      local_178.x = (local_158->m_min).x;
      local_178.y = (local_158->m_min).y;
      pdVar9 = ON_3dPoint::operator[](&local_178,iVar18);
      dVar29 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_c0,*pdVar9);
      local_118.z = (local_120->m_min).z;
      local_118.x = (local_120->m_min).x;
      local_118.y = (local_120->m_min).y;
      pdVar9 = ON_3dPoint::operator[](&local_118,iVar18);
      dVar1 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_c0,*pdVar9);
      ON_Interval::ON_Interval((ON_Interval *)&local_e8,dVar29,dVar1);
      uVar24 = local_e8.x._0_4_;
      uVar25 = local_e8.x._4_4_;
      uVar27 = local_e8.y._0_4_;
      uVar28 = local_e8.y._4_4_;
    }
    else {
      local_178.z = (local_158->m_min).z;
      local_178.x = (local_158->m_min).x;
      local_178.y = (local_158->m_min).y;
      pdVar9 = ON_3dPoint::operator[](&local_178,iVar18);
      dVar29 = *pdVar9;
      pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_c0,0);
      if (*pdVar9 < dVar29) {
LAB_003de561:
        uVar24 = 0x9e331dd2;
        uVar25 = 0xffe5f8bd;
        dVar29 = -1.23432101234321e+308;
      }
      else {
        pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_c0,0);
        dVar29 = *pdVar9;
        local_118.x = (local_120->m_min).x;
        local_118.y = (local_120->m_min).y;
        local_118.z = (local_120->m_min).z;
        pdVar9 = ON_3dPoint::operator[](&local_118,iVar18);
        if (*pdVar9 < dVar29) goto LAB_003de561;
        uVar24 = 0xffffffff;
        uVar25 = 0xffefffff;
        dVar29 = 1.79769313486232e+308;
      }
      ON_Interval::ON_Interval((ON_Interval *)&local_178,(double)CONCAT44(uVar25,uVar24),dVar29);
      uVar24 = local_178.x._0_4_;
      uVar25 = local_178.x._4_4_;
      uVar27 = local_178.y._0_4_;
      uVar28 = local_178.y._4_4_;
    }
    *(undefined4 *)&pOVar15->x = uVar24;
    *(undefined4 *)((long)&pOVar15->x + 4) = uVar25;
    *(undefined4 *)&pOVar15->y = uVar27;
    *(undefined4 *)((long)&pOVar15->y + 4) = uVar28;
    lVar20 = lVar20 + 1;
    pOVar15 = (ON_3dVector *)&pOVar15->z;
  } while (lVar20 != 3);
  ON_Interval::ON_Interval(&local_d0,-1.79769313486232e+308,1.79769313486232e+308);
  pOVar15 = local_78;
  uVar23 = 0;
  do {
    bVar6 = ON_Interval::Intersection(&local_d0,(ON_Interval *)pOVar15);
    pOVar8 = local_130;
    if (1 < uVar23) break;
    uVar23 = uVar23 + 1;
    pOVar15 = (ON_3dVector *)&pOVar15->z;
  } while (bVar6);
  if (bVar6) {
    ON_Interval::ON_Interval((ON_Interval *)&local_178,0.0,1.0);
    bVar6 = ON_Interval::Intersection(&local_d0,(ON_Interval *)&local_178);
    pdVar9 = local_150;
    if (bVar6) {
      if (local_150 != (double *)0x0) {
        pdVar10 = ON_Interval::operator[](&local_d0,0);
        *pdVar9 = *pdVar10;
      }
      if (t1 != (double *)0x0) {
        pdVar9 = ON_Interval::operator[](&local_d0,1);
        *t1 = *pdVar9;
      }
      pdVar9 = ON_Interval::operator[](&local_d0,0);
      ON_Line::PointAt(&local_178,line,*pdVar9);
      pOVar8->z = local_178.z;
      pOVar8->x = local_178.x;
      pOVar8->y = local_178.y;
      dVar29 = ON_Interval::Length(&local_d0);
      return 0.0 < dVar29 | 2;
    }
    pdVar10 = ON_Interval::operator[](&local_d0,1);
    uVar26 = ~(uint)(-(ulong)(*pdVar10 < 0.0) >> 0x20) & 0x3ff00000;
    if (pdVar9 != (double *)0x0) {
      *pdVar9 = (double)((ulong)uVar26 << 0x20);
    }
    if (t1 != (double *)0x0) {
      *t1 = (double)((ulong)uVar26 << 0x20);
      return 1;
    }
    return 1;
  }
  local_a0 = &(this_00->m_min).y;
  local_a8 = &(this_00->m_max).y;
  local_140 = &(this_00->m_min).z;
  local_148 = &(this_00->m_max).z;
  uVar23 = 0;
  do {
    uVar16 = uVar23 + 1;
    uVar13 = 0;
    if (uVar16 != 3) {
      uVar13 = uVar16 & 0xffffffff;
    }
    uVar11 = (ulong)((int)uVar23 - 1);
    if (uVar23 == 0) {
      uVar11 = 2;
    }
    bVar6 = ON_Interval::Intersection
                      (&local_d0,(ON_Interval *)(&local_78[0].x + uVar13 * 2),
                       (ON_Interval *)(&local_78[0].x + uVar11 * 2));
    if (!bVar6) {
      ON_3dVector::ON_3dVector((ON_3dVector *)&local_178,0.0,0.0,0.0);
      pdVar9 = ON_3dVector::operator[]((ON_3dVector *)&local_178,(int)uVar23);
      *pdVar9 = 1.0;
      ON_Line::Direction(&local_c0,line);
      ON_CrossProduct((ON_3dVector *)&local_118,&local_c0,(ON_3dVector *)&local_178);
      dVar29 = ON_3dVector::Length((ON_3dVector *)&local_118);
      if ((dVar29 != 0.0) || (NAN(dVar29))) {
        local_98 = uVar16;
        ON_3dVector::Unitize((ON_3dVector *)&local_118);
        local_88[2] = 0;
        local_88[0] = 0;
        local_88[1] = 0;
        local_f8[0] = 1;
        local_f8[1] = 1;
        local_f8[2] = 1;
        local_f8[uVar23] = local_88[uVar23];
        local_f8[3] = local_f8[0];
        if (local_f8[0] < 0) {
          return 0;
        }
        local_134 = local_f8[1];
        local_90 = (ulong)(uint)local_f8[2];
        iVar17 = local_f8[2] + 1;
        local_18c = -1;
        dVar29 = 0.0;
        local_1a0 = -1;
        local_19c = -1;
        local_128 = uVar23;
        iVar18 = 0;
        do {
          if (-1 < local_134) {
            lVar20 = 0;
            iVar14 = 0;
            if (0 < iVar18) {
              lVar20 = 0x18;
            }
            do {
              if (-1 < (int)local_90) {
                lVar19 = 8;
                if (0 < iVar14) {
                  lVar19 = 0x20;
                }
                iVar22 = 0;
                do {
                  local_e8.x = *(double *)((long)&(local_158->m_min).x + lVar20);
                  local_e8.y = *(double *)((long)&(local_158->m_min).x + lVar19);
                  pdVar9 = local_140;
                  if (0 < iVar22) {
                    pdVar9 = local_148;
                  }
                  local_e8.z = *pdVar9;
                  ON_3dPoint::operator-(&local_c0,&local_e8,&line->from);
                  dVar1 = ON_3dVector::operator*((ON_3dVector *)&local_118,&local_c0);
                  if (((dVar29 == 0.0) && (!NAN(dVar29))) || (ABS(dVar1) < ABS(dVar29))) {
                    dVar29 = dVar1;
                    local_1a0 = iVar14;
                    local_19c = iVar22;
                    local_18c = iVar18;
                  }
                  iVar22 = iVar22 + 1;
                } while (iVar17 != iVar22);
              }
              bVar6 = iVar14 != local_134;
              iVar14 = iVar14 + 1;
            } while (bVar6);
          }
          pdVar9 = local_150;
          this_00 = local_158;
          bVar6 = iVar18 != local_f8[3];
          iVar18 = iVar18 + 1;
        } while (bVar6);
        if (local_18c < 0) {
          return 0;
        }
        pOVar12 = local_120;
        if (local_18c == 0) {
          pOVar12 = local_158;
        }
        pdVar10 = local_a0;
        if (0 < (int)local_1a0) {
          pdVar10 = local_a8;
        }
        local_c0.x = (pOVar12->m_min).x;
        local_c0.y = *pdVar10;
        pdVar10 = local_140;
        if (0 < local_19c) {
          pdVar10 = local_148;
        }
        local_c0.z = *pdVar10;
        dVar29 = ON_3dPoint::operator[](&line->from,(int)local_128);
        pdVar10 = ON_3dPoint::operator[]((ON_3dPoint *)&local_c0,(int)local_128);
        *pdVar10 = dVar29;
        ON_Line::Direction((ON_3dVector *)&local_e8,line);
        pdVar10 = ON_3dVector::operator[]((ON_3dVector *)&local_e8,(int)local_128);
        uVar23 = local_128;
        *pdVar10 = 0.0;
        ON_3dPoint::operator-(&local_48,(ON_3dPoint *)&local_c0,&line->from);
        dVar29 = ON_3dVector::operator*(&local_48,(ON_3dVector *)&local_e8);
        dVar1 = ON_3dVector::LengthSquared((ON_3dVector *)&local_e8);
        dVar29 = dVar29 / dVar1;
        ON_Line::PointAt((ON_3dPoint *)&local_48,line,dVar29);
        uVar16 = local_98;
        if ((0.0 <= dVar29) && (dVar29 <= 1.0)) {
          iVar18 = (int)uVar23;
          dVar1 = ON_3dPoint::operator[](&this_00->m_min,iVar18);
          pdVar10 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,iVar18);
          uVar16 = local_98;
          if (dVar1 <= *pdVar10) {
            pdVar10 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,iVar18);
            dVar1 = *pdVar10;
            dVar2 = ON_3dPoint::operator[](&local_120->m_min,iVar18);
            uVar16 = local_98;
            if (dVar1 <= dVar2) {
              if (pdVar9 != (double *)0x0) {
                *pdVar9 = dVar29;
              }
              if (t1 != (double *)0x0) {
                *t1 = dVar29;
              }
              pdVar9 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,iVar18);
              dVar29 = *pdVar9;
              pdVar9 = ON_3dPoint::operator[]((ON_3dPoint *)&local_c0,iVar18);
              *pdVar9 = dVar29;
              local_130->x = local_c0.x;
              local_130->y = local_c0.y;
              local_130->z = local_c0.z;
              return 1;
            }
          }
        }
      }
    }
    uVar23 = uVar16;
  } while (uVar16 != 3);
  local_1a0 = 1;
  local_140 = (double *)0x0;
  local_148 = (double *)0x0;
  bVar6 = true;
  do {
    bVar5 = bVar6;
    local_1b8 = 3.95252516672997e-323;
    uVar23 = 0;
    uVar26 = 1;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      lVar20 = 0x10;
      bVar6 = true;
      do {
        bVar21 = bVar6;
        local_178.x = *(double *)((long)&(this_00->m_min).x + (long)local_148);
        local_178.y = *(double *)((long)&(this_00->m_min).x + (long)local_1b8);
        local_178.z = *(double *)((long)&(this_00->m_min).x + lVar20);
        ON_Line::ClosestPointTo(line,&local_178,&local_e8.x);
        ON_Line::PointAt(&local_118,line,local_e8.x);
        ON_3dPoint::operator-(&local_c0,&local_118,&local_178);
        iVar18 = 0;
        bVar6 = true;
        uVar13 = (ulong)local_140 & 0xffffffff;
        do {
          pdVar9 = ON_3dVector::operator[](&local_c0,iVar18);
          bVar4 = 0.0 <= *pdVar9;
          if ((int)uVar13 == 0) {
            bVar4 = *pdVar9 <= 0.0;
          }
          if (!bVar6) break;
          iVar18 = 1;
          bVar6 = false;
          uVar13 = uVar23;
        } while (bVar4);
        if (bVar4) {
          if (local_150 != (double *)0x0) {
            *local_150 = local_e8.x;
          }
          if (t1 != (double *)0x0) {
            *t1 = local_e8.x;
          }
          local_130->z = local_178.z;
          goto LAB_003def22;
        }
        lVar20 = 0x28;
        this_00 = local_158;
        bVar6 = false;
      } while (bVar21);
      local_1b8 = 1.58101006669199e-322;
      uVar23 = (ulong)uVar26;
      uVar26 = 2;
      bVar6 = false;
    } while (bVar7);
    local_148 = (double *)0x18;
    iVar18 = 0;
    local_140 = (double *)(ulong)local_1a0;
    local_1a0 = 2;
    bVar6 = false;
  } while (bVar5);
  local_1b8 = 0.0;
  bVar3 = 0;
  bVar6 = true;
  while( true ) {
    pOVar8 = ON_Line::operator[](line,iVar18);
    ClosestPoint(&local_118,local_158,pOVar8);
    local_178.z = local_118.z;
    local_178.x = local_118.x;
    local_178.y = local_118.y;
    pOVar8 = ON_Line::operator[](line,iVar18);
    ON_3dPoint::operator-((ON_3dVector *)&local_118,&local_178,pOVar8);
    ON_Line::Direction(&local_c0,line);
    dVar29 = ON_3dVector::operator*((ON_3dVector *)&local_118,&local_c0);
    if ((bVar6) && (dVar29 <= 0.0)) break;
    if (!(bool)(~bVar3 & 1 | dVar29 < 0.0)) {
      local_1b8 = 1.0;
      break;
    }
    iVar18 = 1;
    bVar3 = 1;
    bVar5 = !bVar6;
    bVar6 = false;
    if (bVar5) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
                 ,0x6e6,"","Should never get here.");
      return 0;
    }
  }
  if (local_150 != (double *)0x0) {
    *local_150 = local_1b8;
  }
  if (t1 != (double *)0x0) {
    *t1 = local_1b8;
  }
  local_130->z = local_178.z;
LAB_003def22:
  *(undefined4 *)&local_130->x = local_178.x._0_4_;
  *(undefined4 *)((long)&local_130->x + 4) = local_178.x._4_4_;
  *(undefined4 *)&local_130->y = local_178.y._0_4_;
  *(undefined4 *)((long)&local_130->y + 4) = local_178.y._4_4_;
  return 1;
}

Assistant:

int ON_BoundingBox::GetClosestPoint( 
  const ON_Line& line, ON_3dPoint& box_point, double* t0, double* t1
  ) const
{
  if(!IsValid() || !line.IsValid()) 
		return 0;			
	
	ON_3dPoint closest;
	
	if(line.Direction().Length()<=ON_SQRT_EPSILON){
		ON_3dPoint center = line.PointAt(.5);
		if(t0) *t0 = 0.0;
		if(t1) *t1 = 1.0;
		box_point = ClosestPoint(center);
		return IsPointIn( center )? 3 : 1;
	}

	ON_Interval over[3];			//parameter overlap for each direction

	for(int j=0; j<3; j++){
		ON_Interval pl( line[0][j], line[1][j]);
		if( pl[0]!=pl[1])
			over[j]= ON_Interval(	pl.NormalizedParameterAt(Min()[j]),
														pl.NormalizedParameterAt(Max()[j])  );
		else 
			if( Min()[j]<=pl[0] && pl[0]<=Max()[j] )
				over[j]=ON_Interval(-ON_DBL_MAX, ON_DBL_MAX);
			else 
				over[j]=ON_Interval(ON_UNSET_VALUE, ON_UNSET_VALUE);
	}



	// Step 1.  Check for an intersection of the infinite line with the box
	ON_Interval overlap(-ON_DBL_MAX, ON_DBL_MAX);	
	bool nonempty=true;
  int i;
	for( i=0;i<3 && nonempty;i++)
		nonempty = overlap.Intersection(over[i]);
	
	if(nonempty){	// infinite line intersects box
		if( overlap.Intersection( ON_Interval(0,1) ) ){
			// Box & Line segment  intersect
			if(t0) *t0 = overlap[0];
			if(t1) *t1 = overlap[1];
			box_point = line.PointAt(overlap[0]);
			return (overlap.Length()>0)? 3 : 2;
		}
		// closest point is at end of line segment
		double EndInd=(overlap[1]<0)? 0.0: 1.0;
		if(t0) *t0 = EndInd;
		if(t1) *t1 = EndInd;
		return 1;
	}


	//  Step 2.  Check for closest point on box edge and line segment interior
	//   In this case when we project orthogonal to the box edge we get a line 
	//   in the plane that doesn't intersect the 2d-box in the plane.  The projection
  //   of the 3d closest point is the closest point of this 2d closest point problem.
	int k[3];
	for(i=0; i<3; i++)
  {
		// Project box and line onto coord plane with normal Unit(i).

		if(!overlap.Intersection( over[(i+1)%3], over[(i+2)%3] )){	
			// Projected line doesnt intersect the projexted box.  
			// Find the closest  vertex of the projected box.  
			ON_3dVector StdUnit(0,0,0);
			StdUnit[i]=1.0;
			ON_3dVector n = ON_CrossProduct(line.Direction(), StdUnit);
			if(n.Length()==0)
				continue;
			n.Unitize();
			int ilo[3]={0,0,0};
			int ihi[3]={1,1,1};
      int imin[3]={-1,-1,-1};
			double amin=0.0;
			ihi[i]=ilo[i];
			for(k[0]=ilo[0];  k[0]<=ihi[0]; k[0]++)
				for(k[1]=ilo[1];  k[1]<=ihi[1]; k[1]++)
					for(k[2]=ilo[2];  k[2]<=ihi[2]; k[2]++){
						double a = n*(Corner(k[0],k[1],k[2]) - line.from);
						if(amin == 0.0 || fabs(a)<fabs(amin))
            {
							amin= a;
							imin[0]=k[0]; imin[1]=k[1]; imin[2]=k[2];
						}
			}
      if ( imin[0] < 0 )
      {
        return 0;
      }
			ON_3dPoint vertex = Corner(imin[0],imin[1],imin[2]);
			vertex[i] = line.from[i];
			// Solve for 2d-closest point between closest corner and projected line 
			ON_3dVector ProjDir = line.Direction();
			ProjDir[i]=0.0;
			double t = ( vertex - line.from)*ProjDir / ProjDir.LengthSquared();
			ON_3dPoint cp = line.PointAt(t);
			if( 0<=t && t<=1 && m_min[i]<=cp[i] &&cp[i]<= m_max[i] ){
				if(t0) *t0 = t;		// found the  closest point 
				if(t1) *t1 = t;
				vertex[i] =  cp[i];
				box_point = vertex;
				return 1;
			}
		}
	}

	//Step 3. Check each Corner of the box for closest points
	for( k[0]=0; k[0]<2; k[0]++)
		for( k[1]=0; k[1]<2; k[1]++)
			for( k[2]=0; k[2]<2; k[2]++){
				ON_3dPoint corner = Corner(k[0],k[1],k[2]);
				double tstar;
				line.ClosestPointTo( corner, &tstar );
				ON_3dPoint cp = line.PointAt( tstar);
				ON_3dVector disp = cp - corner;
				bool InNCone=true;
				for(int j=0;j<2 && InNCone;j++){
					InNCone = InNCone && ( k[j] )? disp[j]>=0 : disp[j]<=0  ;
				}
				if(InNCone){
					if(t0) *t0 = tstar;
					if(t1) *t1 = tstar;
					box_point = corner;
					return 1;
				} 
	}

	//Step 4. Closest point is at a line end
	for(i=0; i<2; i++){
		closest = ClosestPoint(line[i]);
		double dot = (closest - line[i]) * line.Direction();
		if( (i==0 && dot<= 0) || (i==1 && dot>=0) )
    {
			if(t0) *t0 = i;
			if(t1) *t1 = i;
			box_point = closest;
			return 1;
		}
	}

  ON_ERROR("Should never get here.");
	return 0;  
}